

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O3

void __thiscall
RandomizerWorld::add_custom_dialogue(RandomizerWorld *this,Entity *entity,string *text)

{
  mapped_type *this_00;
  Entity *local_60;
  GameText local_58;
  
  local_60 = entity;
  GameText::GameText(&local_58,text,'\x03');
  this_00 = std::
            map<Entity_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Entity_*>,_std::allocator<std::pair<Entity_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_custom_dialogues,&local_60);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&local_58._output_text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._output_text._M_dataplus._M_p != &local_58._output_text.field_2) {
    operator_delete(local_58._output_text._M_dataplus._M_p,
                    local_58._output_text.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._initial_text._M_dataplus._M_p != &local_58._initial_text.field_2) {
    operator_delete(local_58._initial_text._M_dataplus._M_p,
                    local_58._initial_text.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RandomizerWorld::add_custom_dialogue(Entity* entity, const std::string& text)
{
    _custom_dialogues[entity] = GameText(text).get_output();
}